

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseFunctionDeclaration(Parser *this)

{
  bool bVar1;
  element_type *name;
  element_type *this_00;
  size_t sVar2;
  size_t sVar3;
  RuntimeID value;
  mapped_type *this_01;
  RuntimeID local_590;
  String local_588;
  Variant local_568;
  FunctionList *local_540;
  size_t i;
  FunctionList *local_530;
  size_t count_1;
  FunctionSignature **sig_1;
  iterator __end3;
  iterator __begin3;
  FunctionPtrList *__range3;
  FunctionPtrList functions;
  LibraryIPtr library;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *import;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range2_1;
  FunctionList *local_4a8;
  size_t count;
  FunctionSignature *sig;
  iterator __end2;
  iterator __begin2;
  FunctionList *__range2;
  size_t symCount;
  FunctionSignature signature;
  Parser *this_local;
  
  FunctionSignature::FunctionSignature((FunctionSignature *)&symCount);
  __range2 = (FunctionList *)0x0;
  __end2 = std::
           vector<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>::
           begin(&this->m_localFunctions);
  sig = (FunctionSignature *)
        std::vector<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>
        ::end(&this->m_localFunctions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>_>
                                     *)&sig), bVar1) {
    count = (size_t)__gnu_cxx::
                    __normal_iterator<Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>_>
                    ::operator*(&__end2);
    bVar1 = CheckFunctionSignature
                      (this,(this->m_currentSymbol)._M_current,(FunctionSignature *)count,
                       (size_t *)&local_4a8);
    if (bVar1) {
      sVar2 = FunctionSignature::GetLength((FunctionSignature *)count);
      sVar3 = FunctionSignature::GetLength((FunctionSignature *)&symCount);
      if (sVar3 < sVar2) {
        FunctionSignature::operator=((FunctionSignature *)&symCount,(FunctionSignature *)count);
        __range2 = local_4a8;
      }
    }
    __gnu_cxx::
    __normal_iterator<Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
             ::begin(&this->m_importList);
  import = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
           ::end(&this->m_importList);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                             *)&import), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
    ::operator*(&__end2_1);
    name = std::__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_runtime);
    Runtime::GetLibraryInternal
              ((Runtime *)
               &functions.
                super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(String *)name);
    this_00 = std::
              __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&functions.
                             super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Library::Functions((FunctionPtrList *)&__range3,this_00);
    __end3 = std::
             vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
             ::begin((vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                      *)&__range3);
    sig_1 = (FunctionSignature **)
            std::
            vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
            ::end((vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                   *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_Jinx::Impl::FunctionSignature_**,_std::vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>_>
                                       *)&sig_1), bVar1) {
      count_1 = (size_t)__gnu_cxx::
                        __normal_iterator<const_Jinx::Impl::FunctionSignature_**,_std::vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>_>
                        ::operator*(&__end3);
      i = (size_t)(this->m_currentSymbol)._M_current;
      bVar1 = CheckFunctionSignature
                        (this,(SymbolListCItr)i,*(FunctionSignature **)count_1,(size_t *)&local_530)
      ;
      if (bVar1) {
        sVar2 = FunctionSignature::GetLength(*(FunctionSignature **)count_1);
        sVar3 = FunctionSignature::GetLength((FunctionSignature *)&symCount);
        if (sVar3 < sVar2) {
          FunctionSignature::operator=
                    ((FunctionSignature *)&symCount,*(FunctionSignature **)count_1);
          __range2 = local_530;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Jinx::Impl::FunctionSignature_**,_std::vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
    ::~vector((vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
               *)&__range3);
    std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
              ((shared_ptr<Jinx::Impl::Library> *)
               &functions.
                super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
    ::operator++(&__end2_1);
  }
  for (local_540 = (FunctionList *)0x0; local_540 < __range2;
      local_540 = (FunctionList *)
                  ((long)&(local_540->
                          super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::Allocator<Jinx::Impl::FunctionSignature>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1)) {
    NextSymbol(this);
  }
  EmitOpcode(this,PushVal);
  value = FunctionSignature::GetId((FunctionSignature *)&symCount);
  Jinx::Variant::Variant(&local_568,value);
  EmitValue(this,&local_568);
  Jinx::Variant::~Variant(&local_568);
  FunctionSignature::GetName_abi_cxx11_(&local_588,(FunctionSignature *)&symCount);
  local_590 = FunctionSignature::GetId((FunctionSignature *)&symCount);
  this_01 = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
            ::operator[](&this->m_idNameMap,&local_590);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
            (this_01,&local_588);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_588);
  FunctionSignature::~FunctionSignature((FunctionSignature *)&symCount);
  return;
}

Assistant:

inline_t void Parser::ParseFunctionDeclaration()
	{
		FunctionSignature signature;
		size_t symCount = 0;

		// Check for match in local functions
		for (const auto & sig : m_localFunctions)
		{
			size_t count;
			if (CheckFunctionSignature(m_currentSymbol, sig, &count))
			{
				if (sig.GetLength() > signature.GetLength())
				{
					signature = sig;
					symCount = count;
				}
			}
		}

		// Check for match in all import libraries
		for (const auto & import : m_importList)
		{
			auto library = m_runtime->GetLibraryInternal(import);
			auto functions = library->Functions();
			for (const auto & sig : functions)
			{
				size_t count;
				if (CheckFunctionSignature(m_currentSymbol, *sig, &count))
				{
					if (sig->GetLength() > signature.GetLength())
					{
						signature = *sig;
						symCount = count;
					}
				}
			}
		}

		for (size_t i = 0; i < symCount; ++i)
			NextSymbol();

		// Push the function ID on the stack
		EmitOpcode(Opcode::PushVal);
		EmitValue(signature.GetId());
		m_idNameMap[signature.GetId()] = signature.GetName();
	}